

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void deleteTable(sqlite3 *db,Table *pTable)

{
  Index *pIVar1;
  sqlite3 *psVar2;
  VTable *pVVar3;
  void *p;
  Select *p_00;
  int iVar4;
  VTable *pVVar5;
  FKey *pFVar6;
  VTable **ppVVar7;
  char *pKey;
  VTable *pVVar8;
  FKey *pFVar9;
  Index *p_01;
  long lVar10;
  
  p_01 = pTable->pIndex;
  while (p_01 != (Index *)0x0) {
    pIVar1 = p_01->pNext;
    if (((db == (sqlite3 *)0x0) || (db->pnBytesFreed == (int *)0x0)) && (pTable->eTabType != '\x01')
       ) {
      sqlite3HashInsert(&p_01->pSchema->idxHash,p_01->zName,(void *)0x0);
    }
    sqlite3FreeIndex(db,p_01);
    p_01 = pIVar1;
  }
  if (pTable->eTabType == '\x01') {
    if ((db == (sqlite3 *)0x0) || (db->pnBytesFreed == (int *)0x0)) {
      pVVar5 = (pTable->u).vtab.p;
      (pTable->u).tab.pDfltList = (ExprList *)0x0;
      if (pVVar5 != (VTable *)0x0) {
        do {
          psVar2 = pVVar5->db;
          if (psVar2 == (sqlite3 *)0x0) {
            pVVar8 = (VTable *)0x0;
            ppVVar7 = &(pTable->u).vtab.p;
          }
          else {
            pVVar8 = psVar2->pDisconnect;
            ppVVar7 = &psVar2->pDisconnect;
          }
          pVVar3 = pVVar5->pNext;
          *ppVVar7 = pVVar5;
          pVVar5->pNext = pVVar8;
          pVVar5 = pVVar3;
        } while (pVVar3 != (VTable *)0x0);
      }
    }
    pFVar9 = (pTable->u).tab.pFKey;
    if (pFVar9 != (FKey *)0x0) {
      iVar4 = (pTable->u).tab.addColOffset;
      if (0 < iVar4) {
        lVar10 = 0;
        do {
          if ((lVar10 != 1) &&
             (p = *(void **)(((pTable->u).tab.pFKey)->aAction + lVar10 * 8 + -0x2d),
             p != (void *)0x0)) {
            sqlite3DbFreeNN(db,p);
            iVar4 = (pTable->u).tab.addColOffset;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar4);
        pFVar9 = (pTable->u).tab.pFKey;
        if (pFVar9 == (FKey *)0x0) goto LAB_0014fe8d;
      }
      sqlite3DbFreeNN(db,pFVar9);
    }
  }
  else if (pTable->eTabType == '\0') {
    pFVar9 = (pTable->u).tab.pFKey;
    while (pFVar9 != (FKey *)0x0) {
      if ((db == (sqlite3 *)0x0) || (db->pnBytesFreed == (int *)0x0)) {
        pFVar6 = pFVar9->pNextTo;
        if (pFVar9->pPrevTo == (FKey *)0x0) {
          if (pFVar6 == (FKey *)0x0) {
            pKey = pFVar9->zTo;
            pFVar6 = (FKey *)0x0;
          }
          else {
            pKey = pFVar6->zTo;
          }
          sqlite3HashInsert(&pTable->pSchema->fkeyHash,pKey,pFVar6);
        }
        else {
          pFVar9->pPrevTo->pNextTo = pFVar6;
        }
        if (pFVar9->pNextTo != (FKey *)0x0) {
          pFVar9->pNextTo->pPrevTo = pFVar9->pPrevTo;
        }
      }
      fkTriggerDelete(db,pFVar9->apTrigger[0]);
      fkTriggerDelete(db,pFVar9->apTrigger[1]);
      pFVar6 = pFVar9->pNextFrom;
      sqlite3DbFreeNN(db,pFVar9);
      pFVar9 = pFVar6;
    }
  }
  else {
    p_00 = (pTable->u).view.pSelect;
    if (p_00 != (Select *)0x0) {
      clearSelect(db,p_00,1);
    }
  }
LAB_0014fe8d:
  sqlite3DeleteColumnNames(db,pTable);
  if (pTable->zName != (char *)0x0) {
    sqlite3DbFreeNN(db,pTable->zName);
  }
  if (pTable->zColAff != (char *)0x0) {
    sqlite3DbFreeNN(db,pTable->zColAff);
  }
  if (pTable->pCheck != (ExprList *)0x0) {
    exprListDeleteNN(db,pTable->pCheck);
  }
  sqlite3DbFreeNN(db,pTable);
  return;
}

Assistant:

static void SQLITE_NOINLINE deleteTable(sqlite3 *db, Table *pTable){
  Index *pIndex, *pNext;

#ifdef SQLITE_DEBUG
  /* Record the number of outstanding lookaside allocations in schema Tables
  ** prior to doing any free() operations. Since schema Tables do not use
  ** lookaside, this number should not change.
  **
  ** If malloc has already failed, it may be that it failed while allocating
  ** a Table object that was going to be marked ephemeral. So do not check
  ** that no lookaside memory is used in this case either. */
  int nLookaside = 0;
  if( db && !db->mallocFailed && (pTable->tabFlags & TF_Ephemeral)==0 ){
    nLookaside = sqlite3LookasideUsed(db, 0);
  }
#endif

  /* Delete all indices associated with this table. */
  for(pIndex = pTable->pIndex; pIndex; pIndex=pNext){
    pNext = pIndex->pNext;
    assert( pIndex->pSchema==pTable->pSchema
         || (IsVirtual(pTable) && pIndex->idxType!=SQLITE_IDXTYPE_APPDEF) );
    if( (db==0 || db->pnBytesFreed==0) && !IsVirtual(pTable) ){
      char *zName = pIndex->zName;
      TESTONLY ( Index *pOld = ) sqlite3HashInsert(
         &pIndex->pSchema->idxHash, zName, 0
      );
      assert( db==0 || sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
      assert( pOld==pIndex || pOld==0 );
    }
    sqlite3FreeIndex(db, pIndex);
  }

  if( IsOrdinaryTable(pTable) ){
    sqlite3FkDelete(db, pTable);
  }
#ifndef SQLITE_OMIT_VIRTUAL_TABLE
  else if( IsVirtual(pTable) ){
    sqlite3VtabClear(db, pTable);
  }
#endif
  else{
    assert( IsView(pTable) );
    sqlite3SelectDelete(db, pTable->u.view.pSelect);
  }